

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  ImGuiTabItem *pIVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  ImGuiWindow *pIVar7;
  ImDrawList *draw_list;
  ImVec2 IVar8;
  uint3 uVar9;
  ImGuiContext *pIVar10;
  char *pcVar11;
  bool *pbVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  ImU32 id;
  int iVar16;
  undefined4 uVar17;
  ImU32 col;
  ImGuiID close_button_id;
  ulong uVar18;
  ImGuiTabItem *pIVar19;
  size_t sVar20;
  char *pcVar21;
  int iVar22;
  ImGuiTabItem *pIVar23;
  int iVar24;
  ImGuiTabItem *pIVar25;
  ImGuiCol idx;
  ulong uVar26;
  uint flags_00;
  int iVar27;
  bool bVar28;
  uint uVar29;
  float fVar30;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar31;
  float fVar32;
  ImVec2 IVar33;
  bool text_clipped;
  bool just_closed;
  ImGuiTabItem *local_a8;
  ImGuiContext *local_a0;
  ImRect bb;
  bool held;
  float local_64;
  char *local_60;
  bool hovered;
  float fStack_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  bool *local_38;
  
  pIVar25 = (ImGuiTabItem *)(ulong)(uint)flags;
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  pIVar10 = GImGui;
  pIVar7 = GImGui->CurrentWindow;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID(tab_bar,label);
  if ((p_open != (bool *)0x0) && (*p_open == false)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return false;
  }
  if (((uint)flags >> 0x15 & 1) != 0 && p_open != (bool *)0x0) {
    __assert_fail("!p_open || !(flags & ImGuiTabItemFlags_Button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0x1ef8,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  if ((~flags & 0xc0U) == 0) {
    __assert_fail("(flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0x1ef9,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  local_38 = (bool *)0x0;
  flags_00 = flags;
  if (((uint)flags >> 0x14 & 1) == 0) {
    local_38 = p_open;
    flags_00 = flags | 0x100000;
  }
  if (p_open != (bool *)0x0) {
    flags_00 = flags;
  }
  IVar8 = TabItemCalcSize(label,local_38 != (bool *)0x0);
  fVar30 = IVar8.x;
  if (id == 0) {
LAB_00189a5d:
    pIVar25 = (ImGuiTabItem *)0x0;
  }
  else {
    uVar18 = (ulong)(tab_bar->Tabs).Size;
    bVar28 = 0 < (long)uVar18;
    if (0 < (long)uVar18) {
      pIVar25 = (tab_bar->Tabs).Data;
      bVar28 = true;
      if (pIVar25->ID != id) {
        pIVar19 = pIVar25 + (uVar18 - 1);
        uVar13 = 1;
        pIVar23 = pIVar25;
        do {
          uVar26 = uVar13;
          pIVar25 = pIVar19;
          if (uVar18 == uVar26) break;
          pIVar25 = pIVar23 + 1;
          pIVar2 = pIVar23 + 1;
          uVar13 = uVar26 + 1;
          pIVar23 = pIVar25;
        } while (pIVar2->ID != id);
        bVar28 = uVar26 < uVar18;
      }
    }
    if (!bVar28) goto LAB_00189a5d;
  }
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._0_4_ = IVar8.x;
  local_48._4_4_ = IVar8.y;
  local_48._12_4_ = extraout_XMM0_Dd;
  pIVar23 = pIVar25;
  local_60 = label;
  if (pIVar25 == (ImGuiTabItem *)0x0) {
    iVar24 = (tab_bar->Tabs).Size;
    iVar4 = (tab_bar->Tabs).Capacity;
    if (iVar24 == iVar4) {
      iVar24 = iVar24 + 1;
      if (iVar4 == 0) {
        iVar22 = 8;
      }
      else {
        iVar22 = iVar4 / 2 + iVar4;
      }
      if (iVar24 < iVar22) {
        iVar24 = iVar22;
      }
      if (iVar4 < iVar24) {
        pIVar19 = (ImGuiTabItem *)MemAlloc((long)iVar24 * 0x28);
        pIVar23 = (tab_bar->Tabs).Data;
        if (pIVar23 != (ImGuiTabItem *)0x0) {
          local_a8 = pIVar19;
          memcpy(pIVar19,pIVar23,(long)(tab_bar->Tabs).Size * 0x28);
          MemFree((tab_bar->Tabs).Data);
          pIVar19 = local_a8;
        }
        (tab_bar->Tabs).Data = pIVar19;
        (tab_bar->Tabs).Capacity = iVar24;
        fVar30 = (float)local_48._0_4_;
      }
    }
    pIVar23 = (tab_bar->Tabs).Data;
    iVar24 = (tab_bar->Tabs).Size;
    pIVar23[iVar24].ID = 0;
    pIVar23[iVar24].Flags = 0;
    pIVar23[iVar24].LastFrameVisible = -1;
    pIVar23[iVar24].LastFrameSelected = -1;
    pIVar23[iVar24].Offset = 0.0;
    pIVar23[iVar24].Width = 0.0;
    pIVar23[iVar24].ContentWidth = 0.0;
    pIVar19 = pIVar23 + iVar24;
    pIVar19->NameOffset = -1;
    pIVar19->BeginOrder = -1;
    pIVar19->IndexDuringLayout = -1;
    *(undefined4 *)&pIVar23[iVar24].WantClose = 0;
    iVar24 = (tab_bar->Tabs).Size;
    uVar5 = iVar24 + 1;
    (tab_bar->Tabs).Size = uVar5;
    if (iVar24 < 0) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                    ,0x70b,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
    }
    pIVar19 = (tab_bar->Tabs).Data;
    pIVar23 = pIVar19 + ((ulong)uVar5 - 1);
    pIVar23->ID = id;
    pIVar19[(ulong)uVar5 - 1].Width = fVar30;
    tab_bar->TabsAddedNew = true;
  }
  pcVar11 = local_60;
  pIVar19 = (tab_bar->Tabs).Data;
  if ((pIVar23 < pIVar19) || (pIVar19 + (tab_bar->Tabs).Size <= pIVar23)) {
    __assert_fail("it >= Data && it < Data + Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                  ,0x722,
                  "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]");
  }
  tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar23 - (int)pIVar19) >> 3) * -0x3333;
  pIVar23->ContentWidth = fVar30;
  sVar3 = tab_bar->TabsActiveCount;
  tab_bar->TabsActiveCount = sVar3 + 1;
  pIVar23->BeginOrder = sVar3;
  uVar5 = tab_bar->Flags;
  iVar16 = tab_bar->PrevFrameVisible + 1;
  local_a0 = pIVar10;
  iVar24 = pIVar10->FrameCount;
  iVar27 = pIVar23->LastFrameVisible + 1;
  pIVar23->LastFrameVisible = iVar24;
  pIVar23->Flags = flags_00;
  iVar4 = (tab_bar->TabsNames).Buf.Size;
  iVar22 = iVar4 + -1;
  if (iVar4 == 0) {
    iVar22 = 0;
  }
  pIVar23->NameOffset = iVar22;
  local_a8 = pIVar23;
  sVar20 = strlen(local_60);
  ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar11,pcVar11 + sVar20 + 1);
  if (((iVar27 < iVar24) && ((tab_bar->Flags & 2) != 0)) && (tab_bar->NextSelectedTabId == 0)) {
    if (iVar16 < iVar24) {
      if ((flags_00 & 0x200000) == 0 && tab_bar->SelectedTabId == 0) goto LAB_00189c45;
    }
    else if ((flags_00 >> 0x15 & 1) == 0) {
LAB_00189c45:
      tab_bar->NextSelectedTabId = id;
    }
  }
  if ((((flags_00 & 2) != 0) && (tab_bar->SelectedTabId != id)) && ((flags_00 & 0x200000) == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (tab_bar->VisibleTabId == id) {
    tab_bar->VisibleTabWasSubmitted = true;
    bVar28 = true;
  }
  else if ((tab_bar->SelectedTabId == 0 && iVar16 < iVar24) && ((tab_bar->Tabs).Size == 1)) {
    bVar28 = (tab_bar->Flags & 2) == 0;
  }
  else {
    bVar28 = false;
  }
  if ((iVar27 < iVar24) && (pIVar25 == (ImGuiTabItem *)0x0 || iVar24 <= iVar16)) {
    bb.Min.x = 0.0;
    bb.Min.y = 0.0;
    bb.Max.x = 0.0;
    bb.Max.y = 0.0;
    ItemAdd(&bb,id,(ImRect *)0x0,0x18);
    return (bool)((flags_00 >> 0x15 & 1) == 0 & bVar28);
  }
  if (tab_bar->SelectedTabId == id) {
    local_a8->LastFrameSelected = local_a0->FrameCount;
  }
  uVar29 = local_a8->Flags;
  fVar30 = local_a8->Width;
  fVar31 = local_a8->Offset;
  if ((uVar29 & 0xc0) == 0) {
    fVar31 = (float)(int)(fVar31 - tab_bar->ScrollingAnim);
  }
  IVar33.x = fVar31 + (tab_bar->BarRect).Min.x;
  IVar8 = (pIVar7->DC).CursorPos;
  IVar33.y = (tab_bar->BarRect).Min.y + 0.0;
  (pIVar7->DC).CursorPos = IVar33;
  fVar31 = (pIVar7->DC).CursorPos.x;
  fVar6 = (pIVar7->DC).CursorPos.y;
  bb.Min = (pIVar7->DC).CursorPos;
  fVar30 = fVar30 + fVar31;
  fVar32 = (float)local_48._4_4_ + fVar6;
  bb.Max.y = fVar32;
  bb.Max.x = fVar30;
  if ((uVar29 & 0xc0) == 0) {
    uVar9 = (uint3)(uVar29 >> 8);
    uVar17 = (undefined4)CONCAT71((uint7)uVar9,1);
    if (tab_bar->ScrollingRectMinX <= fVar31) {
      uVar17 = CONCAT31(uVar9,tab_bar->ScrollingRectMaxX <= fVar30 &&
                              fVar30 != tab_bar->ScrollingRectMaxX);
    }
  }
  else {
    uVar17 = 0;
  }
  local_48._0_4_ = uVar17;
  local_50 = iVar24;
  local_4c = iVar27;
  if ((char)uVar17 != '\0') {
    uVar29 = -(uint)(tab_bar->ScrollingRectMinX <= fVar31);
    fStack_54 = fVar6 + -1.0;
    _hovered = (float)(~uVar29 & (uint)tab_bar->ScrollingRectMinX | (uint)fVar31 & uVar29);
    _held = tab_bar->ScrollingRectMaxX;
    local_64 = fVar32;
    PushClipRect((ImVec2 *)&hovered,(ImVec2 *)&held,true);
  }
  pIVar10 = local_a0;
  IVar33 = (pIVar7->DC).CursorMaxPos;
  fStack_54 = bb.Max.y - bb.Min.y;
  _hovered = bb.Max.x - bb.Min.x;
  ItemSize((ImVec2 *)&hovered,(local_a0->Style).FramePadding.y);
  (pIVar7->DC).CursorMaxPos = IVar33;
  bVar14 = ItemAdd(&bb,id,(ImRect *)0x0,0);
  if (!bVar14) {
    if (local_48[0] != '\0') {
      PopClipRect();
    }
    (pIVar7->DC).CursorPos = IVar8;
    return bVar28;
  }
  uVar29 = flags_00 & 0x200000;
  bVar14 = ButtonBehavior(&bb,id,&hovered,&held,
                          (uVar29 >> 0x11) + (uint)pIVar10->DragDropActive * 0x200 + 0x1010);
  if ((bVar14) && (uVar29 == 0)) {
    tab_bar->NextSelectedTabId = id;
  }
  if (pIVar10->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((((held == true) && (local_50 <= local_4c)) && (bVar15 = IsMouseDragging(0,-1.0), bVar15)) &&
      ((local_a0->DragDropActive == false && ((tab_bar->Flags & 1) != 0)))) &&
     (((fVar30 = (local_a0->IO).MouseDelta.x, fVar30 < 0.0 &&
       (pIVar1 = &(local_a0->IO).MousePos, pIVar1->x <= bb.Min.x && bb.Min.x != pIVar1->x)) ||
      ((0.0 < fVar30 && (bb.Max.x < (local_a0->IO).MousePos.x)))))) {
    TabBarQueueReorderFromMousePos(tab_bar,local_a8,(local_a0->IO).MousePos);
  }
  draw_list = pIVar7->DrawList;
  idx = 0x22;
  if ((held == false) && (hovered == false)) {
    if (bVar28 == false) {
      idx = (uint)((uVar5 >> 0x15 & 1) == 0) * 3 + 0x21;
    }
    else {
      idx = (uint)((uVar5 >> 0x15 & 1) == 0) * 2 + 0x23;
    }
  }
  col = GetColorU32(idx,1.0);
  TabItemBackground(draw_list,&bb,flags_00,col);
  RenderNavHighlight(&bb,id,1);
  bVar15 = IsItemHovered(0x20);
  if (bVar15) {
    bVar15 = IsMouseClicked(1,false);
    if (bVar15) {
      uVar29 = flags_00 >> 0x15 & 1;
    }
    else {
      bVar15 = IsMouseReleased(1);
      if (!bVar15) goto LAB_0018a056;
    }
    if (uVar29 == 0) {
      tab_bar->NextSelectedTabId = id;
    }
  }
LAB_0018a056:
  pbVar12 = local_38;
  uVar5 = tab_bar->Flags;
  if (local_38 == (bool *)0x0) {
    close_button_id = 0;
  }
  else {
    close_button_id = GetIDWithSeed("#CLOSE",(char *)0x0,id);
  }
  TabItemLabelAndCloseButton
            (draw_list,&bb,uVar5 >> 1 & 4 | flags_00,tab_bar->FramePadding,local_60,id,
             close_button_id,bVar28,&just_closed,&text_clipped);
  if ((pbVar12 != (bool *)0x0) && (just_closed != false)) {
    *pbVar12 = false;
    TabBarCloseTab(tab_bar,local_a8);
  }
  if (local_48[0] != '\0') {
    PopClipRect();
  }
  (pIVar7->DC).CursorPos = IVar8;
  if ((((text_clipped == true) && (local_a0->HoveredId == id)) && (held == false)) &&
     (((local_a0->TooltipSlowDelay <= local_a0->HoveredIdNotActiveTimer &&
        local_a0->HoveredIdNotActiveTimer != local_a0->TooltipSlowDelay &&
       (bVar15 = IsItemHovered(0), pcVar11 = local_60, bVar15)) &&
      (((tab_bar->Flags & 0x20) == 0 && ((local_a8->Flags & 0x10) == 0)))))) {
    pcVar21 = FindRenderedTextEnd(local_60,(char *)0x0);
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar21 - (int)pcVar11),pcVar11);
  }
  if (((flags_00 >> 0x15 & 1) != 0) && (bVar28 = bVar14, tab_bar->SelectedTabId == local_a8->ID)) {
    __assert_fail("!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_widgets.cpp"
                  ,0x1fae,
                  "bool ImGui::TabItemEx(ImGuiTabBar *, const char *, bool *, ImGuiTabItemFlags)");
  }
  return bVar28;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render.
    // We make a call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    if (p_open && !*p_open)
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        return false;
    }

    IM_ASSERT(!p_open || !(flags & ImGuiTabItemFlags_Button));
    IM_ASSERT((flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)); // Can't use both Leading and Trailing

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_bar->TabsAddedNew = true;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (ImS16)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;
    tab->BeginOrder = tab_bar->TabsActiveCount++;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    const bool is_tab_button = (flags & ImGuiTabItemFlags_Button) != 0;
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = (ImS32)tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            if (!is_tab_button)
                tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        ItemAdd(ImRect(), id, NULL, ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus);
        if (is_tab_button)
            return false;
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    const bool is_central_section = (tab->Flags & ImGuiTabItemFlags_SectionMask_) == 0;
    size.x = tab->Width;
    if (is_central_section)
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    else
        window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(tab->Offset, 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    const bool want_clip_rect = is_central_section && (bb.Min.x < tab_bar->ScrollingRectMinX || bb.Max.x > tab_bar->ScrollingRectMaxX);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->ScrollingRectMinX), bb.Min.y - 1), ImVec2(tab_bar->ScrollingRectMaxX, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = ((is_tab_button ? ImGuiButtonFlags_PressedOnClickRelease : ImGuiButtonFlags_PressedOnClick) | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed && !is_tab_button)
        tab_bar->NextSelectedTabId = id;

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                TabBarQueueReorderFromMousePos(tab_bar, tab, g.IO.MousePos);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > TOOLTIP_DELAY && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        if (!is_tab_button)
            tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? GetIDWithSeed("#CLOSE", NULL, id) : 0;
    bool just_closed;
    bool text_clipped;
    TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible, &just_closed, &text_clipped);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip
    // (Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer-> seems ok)
    // (We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar, which g.HoveredId ignores)
    // FIXME: This is a mess.
    // FIXME: We may want disabled tab to still display the tooltip?
    if (text_clipped && g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > g.TooltipSlowDelay && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    IM_ASSERT(!is_tab_button || !(tab_bar->SelectedTabId == tab->ID && is_tab_button)); // TabItemButton should not be selected
    if (is_tab_button)
        return pressed;
    return tab_contents_visible;
}